

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O2

void __thiscall string_conv_wchar_Test::TestBody(string_conv_wchar_Test *this)

{
  int iVar1;
  pointer *__ptr;
  char *pcVar2;
  AssertHelper local_128;
  AssertionResult gtest_ar_6;
  AssertHelper local_110;
  wchar_buffer from_latin_1;
  wchar_buffer from_utf32;
  wchar_buffer from_utf16;
  wchar_buffer from_utf8;
  
  ST::utf8_to_wchar<wchar_t>(&from_utf8,utf8_test_data,0x1c,check_validity);
  from_utf32.m_chars = (wchar_t *)&DAT_0000000a;
  from_latin_1.m_chars = (wchar_t *)from_utf8.m_size;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&from_utf16,"text_size(wide_test_data)","from_utf8.size()",
             (unsigned_long *)&from_utf32,(unsigned_long *)&from_latin_1);
  if ((char)from_utf16.m_chars == '\0') {
    testing::Message::Message((Message *)&from_utf32);
    if (from_utf16.m_size == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)from_utf16.m_size;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&from_latin_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x18d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&from_latin_1,(Message *)&from_utf32)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&from_latin_1);
    if (from_utf32.m_chars != (wchar_t *)0x0) {
      (**(code **)(*(long *)from_utf32.m_chars + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&from_utf16.m_size);
  from_utf32.m_chars = (wchar_t *)((ulong)from_utf32.m_chars & 0xffffffff00000000);
  iVar1 = T_strcmp<wchar_t>(L" \x7fÿĀ翿\xffff𐀀𐀠\x00040000\x0010ffff",from_utf8.m_chars);
  from_latin_1.m_chars = (wchar_t *)CONCAT44(from_latin_1.m_chars._4_4_,iVar1);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&from_utf16,"0","T_strcmp(wide_test_data, from_utf8.data())",
             (int *)&from_utf32,(int *)&from_latin_1);
  if ((char)from_utf16.m_chars == '\0') {
    testing::Message::Message((Message *)&from_utf32);
    if (from_utf16.m_size == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)from_utf16.m_size;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&from_latin_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x18e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&from_latin_1,(Message *)&from_utf32)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&from_latin_1);
    if (from_utf32.m_chars != (wchar_t *)0x0) {
      (**(code **)(*(long *)from_utf32.m_chars + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&from_utf16.m_size);
  ST::utf16_to_wchar<wchar_t>
            (&from_utf16,L" \x7fÿĀ翿\xffff𐀀𐀠\x00040000\x0010ffff",0xe,check_validity);
  from_latin_1.m_chars = (wchar_t *)&DAT_0000000a;
  gtest_ar_6._0_8_ = from_utf16.m_size;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&from_utf32,"text_size(wide_test_data)","from_utf16.size()",
             (unsigned_long *)&from_latin_1,(unsigned_long *)&gtest_ar_6);
  if ((char)from_utf32.m_chars == '\0') {
    testing::Message::Message((Message *)&from_latin_1);
    if (from_utf32.m_size == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)from_utf32.m_size;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x193,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&from_latin_1)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
    if (from_latin_1.m_chars != (wchar_t *)0x0) {
      (**(code **)(*(long *)from_latin_1.m_chars + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&from_utf32.m_size);
  from_latin_1.m_chars = (wchar_t *)((ulong)from_latin_1.m_chars & 0xffffffff00000000);
  iVar1 = T_strcmp<wchar_t>(L" \x7fÿĀ翿\xffff𐀀𐀠\x00040000\x0010ffff",
                            (wchar_t *)CONCAT71(from_utf16.m_chars._1_7_,(char)from_utf16.m_chars));
  gtest_ar_6._0_4_ = iVar1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&from_utf32,"0","T_strcmp(wide_test_data, from_utf16.data())",
             (int *)&from_latin_1,(int *)&gtest_ar_6);
  if ((char)from_utf32.m_chars == '\0') {
    testing::Message::Message((Message *)&from_latin_1);
    if (from_utf32.m_size == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)from_utf32.m_size;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x194,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&from_latin_1)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
    if (from_latin_1.m_chars != (wchar_t *)0x0) {
      (**(code **)(*(long *)from_latin_1.m_chars + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&from_utf32.m_size);
  ST::buffer<wchar_t>::buffer(&from_utf32,L" \x7fÿĀ翿\xffff𐀀𐀠\x00040000\x0010ffff",10);
  gtest_ar_6.success_ = true;
  gtest_ar_6._1_7_ = 0;
  local_128.data_ = (AssertHelperData *)from_utf32.m_size;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&from_latin_1,"text_size(wide_test_data)","from_utf32.size()",
             (unsigned_long *)&gtest_ar_6,(unsigned_long *)&local_128);
  if ((char)from_latin_1.m_chars == '\0') {
    testing::Message::Message((Message *)&gtest_ar_6);
    if (from_latin_1.m_size == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)from_latin_1.m_size;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x199,pcVar2);
    testing::internal::AssertHelper::operator=(&local_128,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    if (gtest_ar_6._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_6._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&from_latin_1.m_size);
  gtest_ar_6._0_8_ = gtest_ar_6._0_8_ & 0xffffffff00000000;
  iVar1 = T_strcmp<wchar_t>(L" \x7fÿĀ翿\xffff𐀀𐀠\x00040000\x0010ffff",from_utf32.m_chars);
  local_128.data_._0_4_ = iVar1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&from_latin_1,"0","T_strcmp(wide_test_data, from_utf32.data())",
             (int *)&gtest_ar_6,(int *)&local_128);
  if ((char)from_latin_1.m_chars == '\0') {
    testing::Message::Message((Message *)&gtest_ar_6);
    if (from_latin_1.m_size == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)from_latin_1.m_size;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x19a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_128,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    if (gtest_ar_6._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_6._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&from_latin_1.m_size);
  ST::latin_1_to_wchar<wchar_t>(&from_latin_1,latin1_data,4);
  local_128.data_ = (AssertHelperData *)&DAT_00000004;
  local_110.data_ = (AssertHelperData *)from_latin_1.m_size;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar_6,"text_size(latin1_wide)","from_latin_1.size()",
             (unsigned_long *)&local_128,(unsigned_long *)&local_110);
  if (gtest_ar_6.success_ == false) {
    testing::Message::Message((Message *)&local_128);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_6.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar_6.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x19e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if (local_128.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_128.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_6.message_);
  local_128.data_ = local_128.data_ & 0xffffffff00000000;
  iVar1 = T_strcmp<wchar_t>(L" ~\xa0ÿ",from_latin_1.m_chars);
  local_110.data_._0_4_ = iVar1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_6,"0","T_strcmp(latin1_wide, from_latin_1.data())",
             (int *)&local_128,(int *)&local_110);
  if (gtest_ar_6.success_ == false) {
    testing::Message::Message((Message *)&local_128);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_6.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar_6.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x19f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if (local_128.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_128.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_6.message_);
  ST::buffer<wchar_t>::~buffer(&from_latin_1);
  ST::buffer<wchar_t>::~buffer(&from_utf32);
  ST::buffer<wchar_t>::~buffer(&from_utf16);
  ST::buffer<wchar_t>::~buffer(&from_utf8);
  return;
}

Assistant:

TEST(string, conv_wchar)
{
    // From UTF-8 to Wide
    ST::wchar_buffer from_utf8 = ST::utf8_to_wchar(utf8_test_data, text_size(utf8_test_data),
                                                   ST::check_validity);
    EXPECT_EQ(text_size(wide_test_data), from_utf8.size());
    EXPECT_EQ(0, T_strcmp(wide_test_data, from_utf8.data()));

    // From UTF-16 to Wide
    ST::wchar_buffer from_utf16 = ST::utf16_to_wchar(utf16_test_data, text_size(utf16_test_data),
                                                     ST::check_validity);
    EXPECT_EQ(text_size(wide_test_data), from_utf16.size());
    EXPECT_EQ(0, T_strcmp(wide_test_data, from_utf16.data()));

    // From UTF-32 to Wide
    ST::wchar_buffer from_utf32 = ST::utf32_to_wchar(test_data, text_size(test_data),
                                                     ST::check_validity);
    EXPECT_EQ(text_size(wide_test_data), from_utf32.size());
    EXPECT_EQ(0, T_strcmp(wide_test_data, from_utf32.data()));

    // From Latin-1 to Wide
    ST::wchar_buffer from_latin_1 = ST::latin_1_to_wchar(latin1_data, text_size(latin1_data));
    EXPECT_EQ(text_size(latin1_wide), from_latin_1.size());
    EXPECT_EQ(0, T_strcmp(latin1_wide, from_latin_1.data()));
}